

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::insert_attribute_before(xml_node *this,char_t *name_,xml_attribute *attr)

{
  xml_node_struct *node;
  xml_attribute_struct *pxVar1;
  uint uVar2;
  xml_attribute_struct *pxVar3;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct **ppxVar5;
  xml_attribute a;
  xml_attribute local_28;
  
  node = this->_root;
  if (node != (xml_node_struct *)0x0) {
    uVar2 = (uint)node->header & 7;
    if (uVar2 == 1) {
      pxVar4 = attr->_attr;
      if (attr->_attr == (xml_attribute_struct *)0x0) {
        return (xml_attribute)(xml_attribute_struct *)0x0;
      }
    }
    else {
      pxVar4 = attr->_attr;
      if (attr->_attr == (xml_attribute_struct *)0x0 || uVar2 != 6) {
        return (xml_attribute)(xml_attribute_struct *)0x0;
      }
    }
    do {
      pxVar3 = pxVar4;
      pxVar4 = pxVar3->prev_attribute_c;
    } while (pxVar4->next_attribute != (xml_attribute_struct *)0x0);
    if (pxVar3 == node->first_attribute) {
      alloc = impl::anon_unknown_0::get_allocator(node);
      pxVar4 = impl::anon_unknown_0::allocate_attribute(alloc);
      if (pxVar4 != (xml_attribute_struct *)0x0) {
        local_28._attr = pxVar4;
        xml_attribute::set_name(&local_28,name_);
        pxVar3 = attr->_attr;
        pxVar1 = pxVar3->prev_attribute_c;
        ppxVar5 = &this->_root->first_attribute;
        if (pxVar1->next_attribute != (xml_attribute_struct *)0x0) {
          ppxVar5 = &pxVar1->next_attribute;
        }
        *ppxVar5 = pxVar4;
        pxVar4->prev_attribute_c = pxVar1;
        pxVar4->next_attribute = pxVar3;
        pxVar3->prev_attribute_c = pxVar4;
        return (xml_attribute)pxVar4;
      }
      return (xml_attribute)(xml_attribute_struct *)0x0;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_attribute xml_node::insert_attribute_before(const char_t* name_, const xml_attribute& attr)
	{
		if ((type() != node_element && type() != node_declaration) || attr.empty()) return xml_attribute();
		
		// check that attribute belongs to *this
		xml_attribute_struct* cur = attr._attr;

		while (cur->prev_attribute_c->next_attribute) cur = cur->prev_attribute_c;

		if (cur != _root->first_attribute) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(impl::get_allocator(_root)));
		if (!a) return xml_attribute();

		a.set_name(name_);

		if (attr._attr->prev_attribute_c->next_attribute)
			attr._attr->prev_attribute_c->next_attribute = a._attr;
		else
			_root->first_attribute = a._attr;
		
		a._attr->prev_attribute_c = attr._attr->prev_attribute_c;
		a._attr->next_attribute = attr._attr;
		attr._attr->prev_attribute_c = a._attr;
				
		return a;
	}